

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O1

string * list_builtin_chat_templates_abi_cxx11_(void)

{
  pointer ppcVar1;
  int iVar2;
  size_t sVar3;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1;
  char *pcVar4;
  string *in_RDI;
  char **tmpl;
  pointer ppcVar5;
  vector<const_char_*,_std::allocator<const_char_*>_> supported_tmpl;
  ostringstream msg;
  vector<const_char_*,_std::allocator<const_char_*>_> local_1c8;
  string *local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = llama_chat_builtin_templates(0,0);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::resize(&local_1c8,(long)iVar2);
  llama_chat_builtin_templates
            (local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                   .super__Vector_impl_data._M_start >> 3);
  local_1b0 = in_RDI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  ppcVar1 = local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppcVar5 = local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      pcVar4 = *ppcVar5;
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)&local_1c8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x20);
      }
      else {
        sVar3 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,sVar3);
      }
      pcVar4 = ", ";
      if (ppcVar5 ==
          local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish + -1) {
        pcVar4 = "";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,pcVar4,
                 (ulong)((uint)(ppcVar5 !=
                               local_1c8.
                               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish + -1) * 2));
      ppcVar5 = ppcVar5 + 1;
    } while (ppcVar5 != ppcVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return local_1b0;
}

Assistant:

static std::string list_builtin_chat_templates() {
    std::vector<const char *> supported_tmpl;
    int32_t res = llama_chat_builtin_templates(nullptr, 0);
    supported_tmpl.resize(res);
    res = llama_chat_builtin_templates(supported_tmpl.data(), supported_tmpl.size());
    std::ostringstream msg;
    for (auto & tmpl : supported_tmpl) {
        msg << tmpl << (&tmpl == &supported_tmpl.back() ? "" : ", ");
    }
    return msg.str();
}